

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  Vdbe *p_00;
  VdbeCursor *pVVar1;
  sqlite3 *db;
  u32 uVar2;
  char *pcVar3;
  char *local_58;
  uint local_48;
  u32 type;
  VdbeCursor *pC;
  Vdbe *v;
  char *zErr;
  int rc;
  char **pzErr_local;
  sqlite3_int64 iRow_local;
  Incrblob *p_local;
  
  v = (Vdbe *)0x0;
  p_00 = (Vdbe *)p->pStmt;
  p_00->aMem[1].flags = 4;
  p_00->aMem[1].u.i = iRow;
  if (p_00->pc < 5) {
    zErr._4_4_ = sqlite3_step(p->pStmt);
  }
  else {
    p_00->pc = 4;
    zErr._4_4_ = sqlite3VdbeExec(p_00);
  }
  if (zErr._4_4_ == 100) {
    pVVar1 = *p_00->apCsr;
    if (p->iCol < pVVar1->nHdrParsed) {
      local_48 = pVVar1->aType[p->iCol];
    }
    else {
      local_48 = 0;
    }
    if (local_48 < 0xc) {
      if (local_48 == 0) {
        local_58 = "null";
      }
      else {
        local_58 = "integer";
        if (local_48 == 7) {
          local_58 = "real";
        }
      }
      v = (Vdbe *)sqlite3MPrintf(p->db,"cannot open value of type %s",local_58);
      zErr._4_4_ = 1;
      sqlite3_finalize(p->pStmt);
      p->pStmt = (sqlite3_stmt *)0x0;
    }
    else {
      p->iOffset = pVVar1->aType[(int)((uint)p->iCol + (int)pVVar1->nField)];
      uVar2 = sqlite3VdbeSerialTypeLen(local_48);
      p->nByte = uVar2;
      p->pCsr = (BtCursor *)pVVar1->uc;
      sqlite3BtreeIncrblobCursor(p->pCsr);
    }
  }
  if (zErr._4_4_ == 100) {
    zErr._4_4_ = 0;
  }
  else if (p->pStmt != (sqlite3_stmt *)0x0) {
    zErr._4_4_ = sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
    if (zErr._4_4_ == 0) {
      v = (Vdbe *)sqlite3MPrintf(p->db,"no such rowid: %lld",iRow);
      zErr._4_4_ = 1;
    }
    else {
      db = p->db;
      pcVar3 = sqlite3_errmsg(p->db);
      v = (Vdbe *)sqlite3MPrintf(db,"%s",pcVar3);
    }
  }
  *pzErr = (char *)v;
  return zErr._4_4_;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of register r[1] in the SQL statement to integer iRow. 
  ** This is done directly as a performance optimization
  */
  v->aMem[1].flags = MEM_Int;
  v->aMem[1].u.i = iRow;

  /* If the statement has been run before (and is paused at the OP_ResultRow)
  ** then back it up to the point where it does the OP_NotExists.  This could
  ** have been down with an extra OP_Goto, but simply setting the program
  ** counter is faster. */
  if( v->pc>4 ){
    v->pc = 4;
    assert( v->aOp[v->pc].opcode==OP_NotExists );
    rc = sqlite3VdbeExec(v);
  }else{
    rc = sqlite3_step(p->pStmt);
  }
  if( rc==SQLITE_ROW ){
    VdbeCursor *pC = v->apCsr[0];
    u32 type = pC->nHdrParsed>p->iCol ? pC->aType[p->iCol] : 0;
    testcase( pC->nHdrParsed==p->iCol );
    testcase( pC->nHdrParsed==p->iCol+1 );
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = pC->aType[p->iCol + pC->nField];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  pC->uc.pCursor;
      sqlite3BtreeIncrblobCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}